

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

uint32 lzham::bitmix32(uint32 a)

{
  uint uVar1;
  uint32 a_local;
  
  uVar1 = a * -0x3f >> 0x11 ^ a * -0x3f;
  uVar1 = uVar1 * -0x1ff0 ^ uVar1 * -0x1ff;
  uVar1 = uVar1 * -0x1c00 ^ uVar1 * -7;
  return uVar1 >> 0xf ^ uVar1;
}

Assistant:

static inline uint32 bitmix32(uint32 a)                    
   {                      
      a -= (a << 6);                                  
      a ^= (a >> 17);                                 
      a -= (a << 9);                                  
      a ^= (a << 4);                                  
      a -= (a << 3);                                  
      a ^= (a << 10);                                 
      a ^= (a >> 15);                                 
      return a;                                       
   }